

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O1

bool __thiscall
icu_63::numparse::impl::StringSegment::operator==(StringSegment *this,UnicodeString *other)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  bool bVar4;
  UnicodeString UStack_58;
  
  toTempUnicodeString(&UStack_58,this);
  if ((UStack_58.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < UStack_58.fUnion.fStackFields.fLengthAndFlags) {
      UStack_58.fUnion.fFields.fLength = (int)UStack_58.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    sVar1 = (other->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (other->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    bVar4 = false;
    if ((((int)sVar1 & 1U) == 0) && (bVar4 = false, UStack_58.fUnion.fFields.fLength == iVar3)) {
      UVar2 = UnicodeString::doEquals(&UStack_58,other,UStack_58.fUnion.fFields.fLength);
      bVar4 = UVar2 != '\0';
    }
  }
  else {
    bVar4 = (bool)(*(byte *)&other->fUnion & 1);
  }
  UnicodeString::~UnicodeString(&UStack_58);
  return bVar4;
}

Assistant:

bool StringSegment::operator==(const UnicodeString& other) const {
    return toTempUnicodeString() == other;
}